

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompose.hpp
# Opt level: O1

void __thiscall
MGARD::Decomposer<float>::decompose_level_1D
          (Decomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  size_t n_nodal;
  float fVar1;
  float *nodal_buffer;
  ulong uVar2;
  size_t n_coeff;
  size_t sVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  
  uVar2 = n >> 1;
  n_nodal = uVar2 + 1;
  nodal_buffer = this->data_buffer;
  n_coeff = n - n_nodal;
  pfVar5 = nodal_buffer;
  pfVar4 = data_pos;
  for (sVar3 = n_coeff; sVar3 != 0; sVar3 = sVar3 - 1) {
    *pfVar5 = *pfVar4;
    pfVar5[uVar2 + 1] = pfVar4[1];
    pfVar5 = pfVar5 + 1;
    pfVar4 = pfVar4 + 2;
  }
  fVar1 = *pfVar4;
  *pfVar5 = fVar1;
  if (n_coeff + 1 == uVar2) {
    pfVar5[1] = (pfVar4[1] + pfVar4[1]) - fVar1;
  }
  if (n != n_nodal) {
    lVar6 = 1;
    do {
      nodal_buffer[uVar2 + lVar6] =
           (nodal_buffer[lVar6 + -1] + nodal_buffer[lVar6]) * -0.5 + nodal_buffer[uVar2 + lVar6];
      lVar6 = lVar6 + 1;
    } while (n - uVar2 != lVar6);
  }
  pfVar5 = this->load_v_buffer;
  if (nodal_row) {
    *pfVar5 = nodal_buffer[uVar2 + 1] * 0.5;
    if (1 < n_coeff) {
      lVar6 = 0;
      do {
        pfVar5[lVar6 + 1] =
             (nodal_buffer[uVar2 + lVar6 + 1] + nodal_buffer[uVar2 + lVar6 + 2]) * 0.5;
        lVar6 = lVar6 + 1;
      } while ((n - uVar2) + -2 != lVar6);
    }
    pfVar5[n_coeff] = nodal_buffer[n - 1] * 0.5;
    if (n_coeff + 1 == uVar2) {
      pfVar5[n_coeff + 1] = 0.0;
    }
  }
  else {
    compute_load_vector_coeff_row<float>
              (pfVar5,n_nodal,n_coeff,h,nodal_buffer,nodal_buffer + uVar2 + 1);
  }
  compute_correction<float>(this->correction_buffer,n_nodal,h,this->load_v_buffer);
  pfVar5 = this->correction_buffer;
  sVar3 = 0;
  do {
    nodal_buffer[sVar3] = pfVar5[sVar3] + nodal_buffer[sVar3];
    sVar3 = sVar3 + 1;
  } while (n_nodal != sVar3);
  memcpy(data_pos,this->data_buffer,n << 2);
  return;
}

Assistant:

void decompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		data_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
		compute_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		add_correction(n_nodal, nodal_buffer);
		memcpy(data_pos, data_buffer, n*sizeof(T));
	}